

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::Util::EncodeBase64_abi_cxx11_
          (string *__return_storage_ptr__,Util *this,char *data,size_t length)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong __n;
  size_t string_pos;
  Util *bytes;
  bool bVar4;
  char finalBytes [4];
  
  uVar2 = (ulong)data / 3;
  __n = (ulong)data % 3;
  string_pos = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(data + (__n ^ 3)) * 4;
  lVar3 = SUB168(auVar1 / ZEXT816(3),0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,SUB161(auVar1 / ZEXT816(3),0));
  bytes = this;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    EncodeByteBlock((char *)bytes,__return_storage_ptr__,string_pos);
    string_pos = string_pos + 4;
    bytes = bytes + 3;
  }
  finalBytes[0] = '\0';
  finalBytes[1] = '\0';
  finalBytes[2] = '\0';
  finalBytes[3] = '\0';
  memcpy(finalBytes,this + ((long)data - __n),__n);
  EncodeByteBlock(finalBytes,__return_storage_ptr__,lVar3 - 4);
  uVar2 = ((__n ^ 3) << 2) / 3;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar3 + -1] = '=';
    lVar3 = lVar3 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase64(const char* data, size_t length)
{
    // calculate extra bytes needed to get a multiple of 3
    size_t extraBytes = 3 - length % 3;

    // number of base64 bytes
    size_t encodedBytes = 4 * (length + extraBytes) / 3;

    std::string encoded_string(encodedBytes, '=');

    // read blocks of 3 bytes
    for (size_t ib3 = 0; ib3 < length / 3; ib3++)
    {
        const size_t iByte = ib3 * 3;
        const size_t iEncodedByte = ib3 * 4;
        const char* currData = &data[iByte];

        EncodeByteBlock(currData, encoded_string, iEncodedByte);
    }

    // if size of data is not a multiple of 3, also encode the final bytes (and add zeros where needed)
    if (extraBytes > 0)
    {
        char finalBytes[4] = { 0,0,0,0 };
        memcpy(&finalBytes[0], &data[length - length % 3], length % 3);

        const size_t iEncodedByte = encodedBytes - 4;
        EncodeByteBlock(&finalBytes[0], encoded_string, iEncodedByte);

        // add '=' at the end
        for (size_t i = 0; i < 4 * extraBytes / 3; i++)
            encoded_string[encodedBytes - i - 1] = '=';
    }
    return encoded_string;
}